

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStream_WaitForFrames(PaAlsaStream *self,unsigned_long *framesAvail,int *xrunOccurred)

{
  StreamDirection streamDir;
  int *piVar1;
  int *in_RDX;
  ulong *in_RSI;
  PaAlsaStream *in_RDI;
  bool bVar2;
  bool bVar3;
  int playbackReady;
  int captureReady;
  pollfd *playbackPfds;
  pollfd *capturePfds;
  int totalFds;
  int pollResults;
  int timeouts;
  int xrun;
  int pollTimeout;
  int pollCapture;
  int pollPlayback;
  PaError result;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  PaAlsaStreamComponent *in_stack_ffffffffffffff80;
  snd_pcm_uframes_t numFrames;
  int *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  int iVar4;
  uint in_stack_ffffffffffffff9c;
  PaAlsaStreamComponent *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  undefined3 uVar5;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  PaSampleFormat *continuePoll;
  pollfd *pollTimeout_00;
  uint local_38;
  int iVar6;
  int iVar7;
  PaError local_1c;
  
  local_1c = 0;
  bVar2 = (in_RDI->playback).pcm != (snd_pcm_t *)0x0;
  bVar3 = (in_RDI->capture).pcm != (snd_pcm_t *)0x0;
  iVar4 = in_RDI->pollTimeout;
  iVar7 = 0;
  iVar6 = 0;
  if (in_RDI->callbackMode == 0) {
    paUtilErr_ = PaAlsaStream_GetAvailableFrames
                           ((PaAlsaStream *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                            &in_stack_ffffffffffffffa0->hostSampleFormat,
                            (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3768\n"
                       );
      local_1c = paUtilErr_;
      goto LAB_0011d133;
    }
    if (iVar7 != 0) goto LAB_0011d133;
    if (*in_RSI != 0) {
      if ((in_RDI->capture).pcm != (snd_pcm_t *)0x0) {
        (in_RDI->capture).ready = 1;
      }
      if ((in_RDI->playback).pcm != (snd_pcm_t *)0x0) {
        (in_RDI->playback).ready = 1;
      }
      goto LAB_0011d133;
    }
  }
LAB_0011caf9:
  do {
    uVar5 = (undefined3)in_stack_ffffffffffffffac;
    in_stack_ffffffffffffffac = CONCAT13(1,uVar5);
    if (!bVar2) {
      in_stack_ffffffffffffffac = CONCAT13(bVar3,uVar5);
    }
    if ((char)((uint)in_stack_ffffffffffffffac >> 0x18) == '\0') {
LAB_0011cf6e:
      if (iVar7 == 0) {
        if ((in_RDI->capture).pcm == (snd_pcm_t *)0x0) {
          iVar4 = 0;
        }
        else {
          iVar4 = (in_RDI->capture).ready;
        }
        if ((in_RDI->playback).pcm == (snd_pcm_t *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = (in_RDI->playback).ready;
        }
        paUtilErr_ = PaAlsaStream_GetAvailableFrames
                               ((PaAlsaStream *)CONCAT44(iVar4,iVar6),in_stack_ffffffffffffffac,
                                in_stack_ffffffffffffffa8,
                                &in_stack_ffffffffffffffa0->hostSampleFormat,
                                (int *)CONCAT44(in_stack_ffffffffffffff9c,iVar4));
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3909\n"
                           );
          local_1c = paUtilErr_;
        }
        else if (((((in_RDI->capture).pcm != (snd_pcm_t *)0x0) &&
                  ((in_RDI->playback).pcm != (snd_pcm_t *)0x0)) && ((in_RDI->playback).ready == 0))
                && (in_RDI->neverDropInput == 0)) {
          if ((in_RDI->capture).framesPerPeriod < *in_RSI) {
            numFrames = (in_RDI->capture).framesPerPeriod;
          }
          else {
            numFrames = *in_RSI;
          }
          PaAlsaStreamComponent_EndProcessing
                    (&in_RDI->capture,numFrames,(int *)&stack0xffffffffffffffd4);
          *in_RSI = 0;
          (in_RDI->capture).ready = 0;
        }
      }
      goto LAB_0011d133;
    }
    local_38 = 0;
    pollTimeout_00 = (pollfd *)0x0;
    continuePoll = (PaSampleFormat *)0x0;
    pthread_testcancel();
    if (bVar3) {
      pollTimeout_00 = in_RDI->pfds;
      paUtilErr_ = PaAlsaStreamComponent_BeginPolling
                             (in_stack_ffffffffffffff80,
                              (pollfd *)
                              CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_BeginPolling( &self->capture, capturePfds )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3797\n"
                         );
        local_1c = paUtilErr_;
        goto LAB_0011d133;
      }
      local_38 = (in_RDI->capture).nfds;
    }
    if (bVar2) {
      in_stack_ffffffffffffffa0 = (PaAlsaStreamComponent *)in_RDI->pfds;
      if (bVar3) {
        in_stack_ffffffffffffff9c = (in_RDI->capture).nfds;
      }
      else {
        in_stack_ffffffffffffff9c = 0;
      }
      continuePoll = &in_stack_ffffffffffffffa0->hostSampleFormat + in_stack_ffffffffffffff9c;
      paUtilErr_ = PaAlsaStreamComponent_BeginPolling
                             (in_stack_ffffffffffffff80,
                              (pollfd *)
                              CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_BeginPolling( &self->playback, playbackPfds )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3804\n"
                         );
        local_1c = paUtilErr_;
        goto LAB_0011d133;
      }
      local_38 = (in_RDI->playback).nfds + local_38;
    }
    if (in_RDI->callbackMode != 0) {
      pthread_setcancelstate(0,(int *)0x0);
    }
    streamDir = poll((pollfd *)in_RDI->pfds,(long)(int)local_38,iVar4);
    if (in_RDI->callbackMode != 0) {
      pthread_setcancelstate(1,(int *)0x0);
    }
    if ((int)streamDir < 0) {
      piVar1 = __errno_location();
      if (*piVar1 != 4) {
        paUtilErr_ = -0x2702;
        PaUtil_DebugPrint(
                         "Expression \'paInternalError\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3836\n"
                         );
        local_1c = paUtilErr_;
        goto LAB_0011d133;
      }
      Pa_Sleep(0x11ccf7);
      goto LAB_0011caf9;
    }
    if (streamDir == StreamDirection_In) {
      iVar6 = iVar6 + 1;
      if (1 < iVar6) {
        Pa_Sleep(0x11cd57);
      }
      if (0x7ff < iVar6) {
        *in_RSI = 0;
        iVar7 = 1;
        goto LAB_0011d133;
      }
    }
    else if (0 < (int)streamDir) {
      iVar6 = 0;
      if ((bVar3) &&
         (paUtilErr_ = PaAlsaStreamComponent_EndPolling
                                 (in_stack_ffffffffffffffa0,
                                  (pollfd *)
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                  (int *)CONCAT44(in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90),
                                  in_stack_ffffffffffffff88), paUtilErr_ < 0)) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3871\n"
                         );
        local_1c = paUtilErr_;
        goto LAB_0011d133;
      }
      if ((bVar2) &&
         (paUtilErr_ = PaAlsaStreamComponent_EndPolling
                                 (in_stack_ffffffffffffffa0,
                                  (pollfd *)
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                  (int *)CONCAT44(in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90),
                                  in_stack_ffffffffffffff88), paUtilErr_ < 0)) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3875\n"
                         );
        local_1c = paUtilErr_;
        goto LAB_0011d133;
      }
      if (iVar7 != 0) goto LAB_0011cf6e;
    }
  } while (((in_RDI->capture).pcm == (snd_pcm_t *)0x0) ||
          ((in_RDI->playback).pcm == (snd_pcm_t *)0x0));
  if ((!bVar3) || (bVar2)) {
    if (((bVar2) && (!bVar3)) &&
       (paUtilErr_ = ContinuePoll((PaAlsaStream *)CONCAT44(iVar7,iVar6),streamDir,
                                  &pollTimeout_00->fd,(int *)continuePoll), paUtilErr_ < 0)) {
      PaUtil_DebugPrint(
                       "Expression \'ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3895\n"
                       );
      local_1c = paUtilErr_;
      goto LAB_0011d133;
    }
    goto LAB_0011caf9;
  }
  paUtilErr_ = ContinuePoll((PaAlsaStream *)CONCAT44(iVar7,iVar6),streamDir,&pollTimeout_00->fd,
                            (int *)continuePoll);
  if (-1 < paUtilErr_) goto LAB_0011caf9;
  PaUtil_DebugPrint(
                   "Expression \'ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3891\n"
                   );
  local_1c = paUtilErr_;
LAB_0011d133:
  do {
    if (iVar7 == 0) {
      if (*in_RSI == 0) goto LAB_0011d204;
      bVar2 = true;
      if ((in_RDI->capture).ready == 0) {
        bVar2 = (in_RDI->playback).ready != 0;
      }
      if (bVar2) goto LAB_0011d204;
      PaUtil_DebugPrint(
                       "Expression \'self->capture.ready || self->playback.ready\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3942\n"
                       );
      local_1c = -0x2702;
      goto LAB_0011d133;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun(in_RDI);
    if (-1 < paUtilErr_) {
      *in_RSI = 0;
LAB_0011d204:
      *in_RDX = iVar7;
      return local_1c;
    }
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStream_HandleXrun( self )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3934\n"
                     );
    local_1c = paUtilErr_;
  } while( true );
}

Assistant:

static PaError PaAlsaStream_WaitForFrames( PaAlsaStream *self, unsigned long *framesAvail, int *xrunOccurred )
{
    PaError result = paNoError;
    int pollPlayback = self->playback.pcm != NULL, pollCapture = self->capture.pcm != NULL;
    int pollTimeout = self->pollTimeout;
    int xrun = 0, timeouts = 0;
    int pollResults;

    assert( self );
    assert( framesAvail );

    if( !self->callbackMode )
    {
        /* In blocking mode we will only wait if necessary */
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL,
                    framesAvail, &xrun ) );
        if( xrun )
        {
            goto end;
        }

        if( *framesAvail > 0 )
        {
            /* Mark pcms ready from poll */
            if( self->capture.pcm )
                self->capture.ready = 1;
            if( self->playback.pcm )
                self->playback.ready = 1;

            goto end;
        }
    }

    while( pollPlayback || pollCapture )
    {
        int totalFds = 0;
        struct pollfd *capturePfds = NULL, *playbackPfds = NULL;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif
        if( pollCapture )
        {
            capturePfds = self->pfds;
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->capture, capturePfds ) );
            totalFds += self->capture.nfds;
        }
        if( pollPlayback )
        {
            /* self->pfds is in effect an array of fds; if necessary, index past the capture fds */
            playbackPfds = self->pfds + (pollCapture ? self->capture.nfds : 0);
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->playback, playbackPfds ) );
            totalFds += self->playback.nfds;
        }

#ifdef PTHREAD_CANCELED
        if( self->callbackMode )
        {
            /* To allow 'Abort' to terminate the callback thread, enable cancelability just for poll() (& disable after) */
            pthread_setcancelstate( PTHREAD_CANCEL_ENABLE, NULL );
        }
#endif

        pollResults = poll( self->pfds, totalFds, pollTimeout );

#ifdef PTHREAD_CANCELED
        if( self->callbackMode )
        {
            pthread_setcancelstate( PTHREAD_CANCEL_DISABLE, NULL );
        }
#endif

        if( pollResults < 0 )
        {
            /*  XXX: Depend on preprocessor condition? */
            if( errno == EINTR )
            {
                /* gdb */
                Pa_Sleep( 1 ); /* avoid hot loop */
                continue;
            }

            /* TODO: Add macro for checking system calls */
            PA_ENSURE( paInternalError );
        }
        else if( pollResults == 0 )
        {
           /* Suspended, paused or failed device can provide 0 poll results. To avoid deadloop in such situation
            * we simply run counter 'timeouts' which detects 0 poll result and accumulates. As soon as 2048 timouts (around 2 seconds)
            * are achieved we simply fail function with paTimedOut to notify waiting methods that device is not capable
            * of providing audio data anymore and needs some corresponding recovery action.
            * Note that 'timeouts' is reset to 0 if poll() managed to return non 0 results.
            */

            /*PA_DEBUG(( "%s: poll == 0 results, timed out, %d times left\n", __FUNCTION__, 2048 - timeouts ));*/
            ++ timeouts;
            if( timeouts > 1 ) /* sometimes device times out, but normally once, so we do not sleep any time */
            {
                Pa_Sleep( 1 ); /* avoid hot loop */
            }
            /* not else ! */
            if( timeouts >= 2048 ) /* audio device not working, shall return error to notify waiters */
            {
                *framesAvail = 0; /* no frames available for processing */
                xrun = 1; /* try recovering device */

                PA_DEBUG(( "%s: poll timed out\n", __FUNCTION__, timeouts ));
                goto end;/*PA_ENSURE( paTimedOut );*/
            }
        }
        else if( pollResults > 0 )
        {
            /* reset timouts counter */
            timeouts = 0;

            /* check the return status of our pfds */
            if( pollCapture )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun ) );
            }
            if( pollPlayback )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun ) );
            }
            if( xrun )
            {
                break;
            }
        }

        /* @concern FullDuplex If only one of two pcms is ready we may want to compromise between the two.
         * If there is less than half a period's worth of samples left of frames in the other pcm's buffer we will
         * stop polling.
         */
        if( self->capture.pcm && self->playback.pcm )
        {
            if( pollCapture && !pollPlayback )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture ) );
            }
            else if( pollPlayback && !pollCapture )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback ) );
            }
        }
    }

    if( !xrun )
    {
        /* Get the number of available frames for the pcms that are marked ready.
         * @concern FullDuplex If only one direction is marked ready (from poll), the number of frames available for
         * the other direction is returned. Output is normally preferred over capture however, so capture frames may be
         * discarded to avoid overrun unless paNeverDropInput is specified.
         */
        int captureReady = self->capture.pcm ? self->capture.ready : 0,
            playbackReady = self->playback.pcm ? self->playback.ready : 0;
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun ) );

        if( self->capture.pcm && self->playback.pcm )
        {
            if( !self->playback.ready && !self->neverDropInput )
            {
                /* Drop input, a period's worth */
                assert( self->capture.ready );
                PaAlsaStreamComponent_EndProcessing( &self->capture, PA_MIN( self->capture.framesPerPeriod,
                            *framesAvail ), &xrun );
                *framesAvail = 0;
                self->capture.ready = 0;
            }
        }
        else if( self->capture.pcm )
            assert( self->capture.ready );
        else
            assert( self->playback.ready );
    }

end:
error:
    if( xrun )
    {
        /* Recover from the xrun state */
        PA_ENSURE( PaAlsaStream_HandleXrun( self ) );
        *framesAvail = 0;
    }
    else
    {
        if( 0 != *framesAvail )
        {
            /* If we're reporting frames eligible for processing, one of the handles better be ready */
            PA_UNLESS( self->capture.ready || self->playback.ready, paInternalError );
        }
    }
    *xrunOccurred = xrun;

    return result;
}